

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

Token * __thiscall Lexer::operator()(Token *__return_storage_ptr__,Lexer *this)

{
  TOK TVar1;
  
  __return_storage_ptr__->kind = T_EOF_SYMBOL;
  __return_storage_ptr__->line = 0;
  (__return_storage_ptr__->text)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->text).field_2
  ;
  (__return_storage_ptr__->text)._M_string_length = 0;
  (__return_storage_ptr__->text).field_2._M_local_buf[0] = '\0';
  TVar1 = yylex0(this);
  __return_storage_ptr__->kind = TVar1;
  __return_storage_ptr__->line = this->yytokenlineno;
  std::__cxx11::string::swap((string *)&__return_storage_ptr__->text);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::operator()() {
  Token tk;
  tk.kind = yylex0();
  tk.line = yytokenlineno;
  std::swap(tk.text, yytext);
  return tk;
}